

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O1

void __thiscall
nigel::IMC_Generator::generateOperation
          (IMC_Generator *this,OperationCombination comb,HexOp op_val,HexOp op_const,HexOp op_atr0,
          shared_ptr<nigel::IM_Operator> *lOp,shared_ptr<nigel::IM_Operator> *rOp,
          shared_ptr<nigel::Token> *token)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *this_00;
  bool bVar5;
  undefined1 local_9d0 [24];
  undefined1 local_9b8 [20];
  undefined4 uStack_9a4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_9a0;
  undefined1 local_998 [20];
  undefined4 uStack_984;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_980;
  shared_ptr<nigel::IM_Operator> local_978;
  shared_ptr<nigel::IM_Operator> local_968;
  shared_ptr<nigel::IM_Operator> local_958;
  shared_ptr<nigel::IM_Operator> local_948;
  shared_ptr<nigel::IM_Operator> local_938;
  shared_ptr<nigel::IM_Operator> local_928;
  shared_ptr<nigel::IM_Operator> local_918;
  shared_ptr<nigel::Token> local_908;
  shared_ptr<nigel::IM_Operator> local_8f8;
  shared_ptr<nigel::IM_Operator> local_8e8;
  shared_ptr<nigel::IM_Operator> local_8d8;
  shared_ptr<nigel::IM_Operator> local_8c8;
  shared_ptr<nigel::IM_Operator> local_8b8;
  shared_ptr<nigel::IM_Operator> local_8a8;
  shared_ptr<nigel::IM_Operator> local_898;
  shared_ptr<nigel::IM_Operator> local_888;
  shared_ptr<nigel::IM_Operator> local_878;
  shared_ptr<nigel::IM_Operator> local_868;
  shared_ptr<nigel::IM_Operator> local_858;
  shared_ptr<nigel::IM_Operator> local_848;
  shared_ptr<nigel::IM_Operator> local_838;
  shared_ptr<nigel::IM_Operator> local_828;
  shared_ptr<nigel::IM_Operator> local_818;
  shared_ptr<nigel::IM_Operator> local_808;
  shared_ptr<nigel::IM_Operator> local_7f8;
  shared_ptr<nigel::IM_Operator> local_7e8;
  shared_ptr<nigel::IM_Operator> local_7d8;
  undefined1 local_7c8 [32];
  shared_ptr<nigel::IM_Operator> local_7a8;
  shared_ptr<nigel::IM_Operator> local_798;
  shared_ptr<nigel::IM_Operator> local_788;
  shared_ptr<nigel::IM_Operator> local_778;
  shared_ptr<nigel::IM_Operator> local_768;
  undefined1 local_758 [32];
  shared_ptr<nigel::IM_Operator> local_738;
  shared_ptr<nigel::IM_Operator> local_728;
  shared_ptr<nigel::IM_Operator> local_718;
  shared_ptr<nigel::IM_Operator> local_708;
  shared_ptr<nigel::IM_Operator> local_6f8;
  shared_ptr<nigel::IM_Operator> local_6e8;
  shared_ptr<nigel::IM_Operator> local_6d8;
  shared_ptr<nigel::IM_Operator> local_6c8;
  shared_ptr<nigel::IM_Operator> local_6b8;
  shared_ptr<nigel::IM_Operator> local_6a8;
  shared_ptr<nigel::IM_Operator> local_698;
  shared_ptr<nigel::IM_Operator> local_688;
  shared_ptr<nigel::IM_Operator> local_678;
  shared_ptr<nigel::IM_Operator> local_668;
  shared_ptr<nigel::IM_Operator> local_658;
  shared_ptr<nigel::IM_Operator> local_648;
  shared_ptr<nigel::IM_Operator> local_638;
  shared_ptr<nigel::IM_Operator> local_628;
  shared_ptr<nigel::IM_Operator> local_618;
  shared_ptr<nigel::IM_Operator> local_608;
  shared_ptr<nigel::IM_Operator> local_5f8;
  shared_ptr<nigel::IM_Operator> local_5e8;
  shared_ptr<nigel::IM_Operator> local_5d8;
  shared_ptr<nigel::IM_Operator> local_5c8;
  shared_ptr<nigel::IM_Operator> local_5b8;
  shared_ptr<nigel::IM_Operator> local_5a8;
  shared_ptr<nigel::IM_Operator> local_598;
  shared_ptr<nigel::IM_Operator> local_588;
  shared_ptr<nigel::IM_Operator> local_578;
  shared_ptr<nigel::IM_Operator> local_568;
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::IM_Operator> local_548;
  shared_ptr<nigel::IM_Operator> local_538;
  shared_ptr<nigel::IM_Operator> local_528;
  shared_ptr<nigel::IM_Operator> local_518;
  shared_ptr<nigel::IM_Operator> local_508;
  shared_ptr<nigel::IM_Operator> local_4f8;
  shared_ptr<nigel::IM_Operator> local_4e8;
  shared_ptr<nigel::IM_Operator> local_4d8;
  shared_ptr<nigel::IM_Operator> local_4c8;
  shared_ptr<nigel::IM_Operator> local_4b8;
  shared_ptr<nigel::IM_Operator> local_4a8;
  shared_ptr<nigel::IM_Operator> local_498;
  shared_ptr<nigel::IM_Operator> local_488;
  shared_ptr<nigel::IM_Operator> local_478;
  shared_ptr<nigel::IM_Operator> local_468;
  shared_ptr<nigel::IM_Operator> local_458;
  shared_ptr<nigel::IM_Operator> local_448;
  shared_ptr<nigel::IM_Operator> local_438;
  shared_ptr<nigel::IM_Operator> local_428;
  shared_ptr<nigel::IM_Operator> local_418;
  shared_ptr<nigel::IM_Operator> local_408;
  shared_ptr<nigel::IM_Operator> local_3f8;
  shared_ptr<nigel::IM_Operator> local_3e8;
  shared_ptr<nigel::IM_Operator> local_3d8;
  shared_ptr<nigel::IM_Operator> local_3c8;
  shared_ptr<nigel::IM_Operator> local_3b8;
  shared_ptr<nigel::IM_Operator> local_3a8;
  shared_ptr<nigel::IM_Operator> local_398;
  shared_ptr<nigel::IM_Operator> local_388;
  shared_ptr<nigel::IM_Operator> local_378;
  shared_ptr<nigel::IM_Operator> local_368;
  shared_ptr<nigel::IM_Operator> local_358;
  shared_ptr<nigel::IM_Operator> local_348;
  shared_ptr<nigel::IM_Operator> local_338;
  shared_ptr<nigel::IM_Operator> local_328;
  shared_ptr<nigel::IM_Operator> local_318;
  shared_ptr<nigel::IM_Operator> local_308;
  shared_ptr<nigel::IM_Operator> local_2f8;
  shared_ptr<nigel::IM_Operator> local_2e8;
  shared_ptr<nigel::IM_Operator> local_2d8;
  shared_ptr<nigel::IM_Operator> local_2c8;
  shared_ptr<nigel::IM_Operator> local_2b8;
  shared_ptr<nigel::IM_Operator> local_2a8;
  shared_ptr<nigel::IM_Operator> local_298;
  shared_ptr<nigel::IM_Operator> local_288;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_Operator> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  shared_ptr<nigel::IM_Operator> local_1f8;
  shared_ptr<nigel::IM_Operator> local_1e8;
  shared_ptr<nigel::IM_Operator> local_1d8;
  shared_ptr<nigel::IM_Operator> local_1c8;
  shared_ptr<nigel::IM_Operator> local_1b8;
  shared_ptr<nigel::IM_Operator> local_1a8;
  shared_ptr<nigel::IM_Operator> local_198;
  shared_ptr<nigel::IM_Operator> local_188;
  shared_ptr<nigel::IM_Operator> local_178;
  undefined1 local_160 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_148;
  undefined1 local_140 [32];
  shared_ptr<nigel::IM_Operator> local_120;
  shared_ptr<nigel::IM_Operator> local_110;
  shared_ptr<nigel::IM_Operator> local_100;
  shared_ptr<nigel::IM_Operator> local_f0;
  shared_ptr<nigel::IM_Operator> local_e0;
  shared_ptr<nigel::IM_Operator> local_d0;
  shared_ptr<nigel::IM_Operator> local_c0;
  shared_ptr<nigel::IM_Operator> local_b0;
  shared_ptr<nigel::IM_Operator> local_a0;
  shared_ptr<nigel::IM_Operator> local_90;
  shared_ptr<nigel::IM_Operator> local_80;
  shared_ptr<nigel::IM_Operator> local_70;
  shared_ptr<nigel::IM_Operator> local_60;
  shared_ptr<nigel::IM_Operator> local_50;
  shared_ptr<nigel::IM_Operator> local_40;
  
  local_9d0._20_4_ = op_val;
  switch(comb) {
  case vv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
    if (*(int *)(local_9d0._0_8_ + 0x1c) == 0) {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_9b8 + 0x10));
      bVar5 = *(int *)(CONCAT44(uStack_9a4,local_9b8._16_4_) + 0x1c) == 0;
      if (local_9a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_9a0);
      }
    }
    else {
      bVar5 = false;
    }
    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
    }
    if (bVar5) {
      local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_6d8,&local_178);
      if (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_6e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_6e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,local_9d0._20_4_,&local_6e8,&local_188);
      _Var4._M_pi = local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_188.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_6e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      if (*(int *)(local_9d0._0_8_ + 0x1c) == 1) {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9b8);
        bVar5 = *(int *)(local_9b8._0_8_ + 0x1c) == 0;
        if ((element_type *)local_9b8._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9b8._8_8_);
        }
      }
      else {
        bVar5 = false;
      }
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      if (bVar5) {
        local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_6f8,&local_198);
        if (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_198.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_6f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_1a8,&local_1b8);
        if (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if ((element_type *)
            local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_708.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_708.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,local_9d0._20_4_,&local_708,&local_1c8);
        _Var4._M_pi = local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var4._M_pi = local_708.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
        iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
        if ((iVar1 == 4) || (iVar1 == 2)) {
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_140);
          bVar5 = *(int *)(local_140._0_8_ + 0x1c) == 0;
        }
        else {
          bVar5 = false;
        }
        if (((iVar1 == 4) || (iVar1 == 2)) &&
           ((element_type *)local_140._8_8_ != (element_type *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_140._8_8_);
        }
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        if (!bVar5) {
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
          if (*(int *)(local_9d0._0_8_ + 0x1c) == 0) {
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_160 + 0x10));
            bVar5 = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_160._16_8_ + 0x10))->
                    _M_weak_count == 1;
            if (local_148 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148);
            }
          }
          else {
            bVar5 = false;
          }
          if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
          }
          uVar3 = local_9d0._20_4_;
          if (bVar5) {
            local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
            if (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_dptr_const,&local_738,&local_208);
            if (local_208.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_208.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_738.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_738.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,movx_a_dptr,&local_218,&local_228);
            if (local_228.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_228.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if (local_218.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_218.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            local_758._0_4_ = B;
            std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                      ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                       (allocator<nigel::IM_SFR> *)(local_998 + 0x10),(SFR *)local_758);
            uVar2 = local_9d0._8_8_;
            local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_9d0._0_8_;
            local_40.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
            local_9d0._0_8_ = (element_type *)0x0;
            local_9d0._8_8_ = (element_type *)0x0;
            local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_adr_a,&local_40,&local_238);
            if (local_238.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_238.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((element_type *)uVar2 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
            }
            if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
            }
            local_758._16_8_ =
                 (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_758._24_8_ =
                 (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_)->
                     _M_use_count + 1;
                UNLOCK();
              }
              else {
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_)->_M_use_count =
                     ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_)->
                     _M_use_count + 1;
              }
            }
            local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)(local_758 + 0x10),&local_248);
            if (local_248.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_248.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._24_8_);
            }
            local_758._0_4_ = B;
            std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                      ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                       (allocator<nigel::IM_SFR> *)(local_998 + 0x10),(SFR *)local_758);
            this_00 = (element_type *)local_9d0._8_8_;
            local_50.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_9d0._0_8_;
            local_50.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
            local_9d0._0_8_ = (element_type *)0x0;
            local_9d0._8_8_ = (element_type *)0x0;
            local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_258.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            addCmd(this,uVar3,&local_50,&local_258);
            _Var4._M_pi = local_258.
                          super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
          }
          else {
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
            if (*(int *)(local_9d0._0_8_ + 0x1c) == 1) {
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_758);
              bVar5 = *(int *)(CONCAT44(local_758._4_4_,local_758._0_4_) + 0x1c) == 1;
              if ((element_type *)local_758._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_758._8_8_);
              }
            }
            else {
              bVar5 = false;
            }
            if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
            }
            uVar3 = local_9d0._20_4_;
            if (bVar5) {
              local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_dptr_const,&local_768,&local_268);
              if (local_268.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_268.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_768.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_768.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,movx_a_dptr,&local_278,&local_288);
              if (local_288.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_288.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_278.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_278.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_998._16_4_ = 0xf0;
              std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                        ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                         (allocator<nigel::IM_SFR> *)local_998,(SFR *)(local_998 + 0x10));
              uVar2 = local_9d0._8_8_;
              local_60.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_9d0._0_8_;
              local_60.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
              local_9d0._0_8_ = (element_type *)0x0;
              local_9d0._8_8_ = (element_type *)0x0;
              local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_adr_a,&local_60,&local_298);
              if (local_298.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_298.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((element_type *)uVar2 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
              }
              if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
              }
              local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_dptr_const,&local_778,&local_2a8);
              if (local_2a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2a8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_778.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_778.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,movx_a_dptr,&local_2b8,&local_2c8);
              if (local_2c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2c8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_2b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2b8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_998._16_4_ = 0xf0;
              std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                        ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                         (allocator<nigel::IM_SFR> *)local_998,(SFR *)(local_998 + 0x10));
              this_00 = (element_type *)local_9d0._8_8_;
              local_70.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_9d0._0_8_;
              local_70.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
              local_9d0._0_8_ = (element_type *)0x0;
              local_9d0._8_8_ = (element_type *)0x0;
              local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,uVar3,&local_70,&local_2d8);
              _Var4._M_pi = local_2d8.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
            }
            else {
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
              iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
              if ((iVar1 == 4) || (iVar1 == 2)) {
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_998 + 0x10));
                bVar5 = *(int *)(CONCAT44(uStack_984,local_998._16_4_) + 0x1c) == 1;
              }
              else {
                bVar5 = false;
              }
              if (((iVar1 == 4) || (iVar1 == 2)) &&
                 (local_980 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_980);
              }
              if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
              }
              if (!bVar5) {
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
                if (*(int *)(local_9d0._0_8_ + 0x1c) == 0) {
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_998);
                  bVar5 = (*(int *)(CONCAT44(local_998._4_4_,local_998._0_4_) + 0x1c) - 2U &
                          0xfffffffd) == 0;
                  if ((element_type *)local_998._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_998._8_8_);
                  }
                }
                else {
                  bVar5 = false;
                }
                if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
                }
                if (bVar5) {
                  local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)
                           ._M_ptr;
                  local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi =
                       (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if (local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      (local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_7a8.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      (local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->_M_use_count =
                           (local_7a8.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)->_M_use_count + 1;
                    }
                  }
                  generateLoadStackR0(this,&local_7a8);
                  if (local_7a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_7a8.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  local_7c8._16_8_ =
                       (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr;
                  local_7c8._24_8_ =
                       (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                       _M_refcount._M_pi;
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._24_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._24_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_7c8._24_8_)->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._24_8_)->
                      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_7c8._24_8_)->_M_use_count + 1;
                    }
                  }
                  local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  addCmd(this,mov_a_adr,(shared_ptr<nigel::IM_Operator> *)(local_7c8 + 0x10),
                         &local_358);
                  if (local_358.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_358.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                  }
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._24_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._24_8_);
                  }
                  local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_368.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr = (element_type *)0x0;
                  local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  addCmd(this,op_atr0,&local_368,&local_378);
                  _Var4._M_pi = local_368.
                                super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi;
                  if (local_378.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              (local_378.
                               super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi);
                    _Var4._M_pi = local_368.
                                  super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                  }
                }
                else {
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
                  if (*(int *)(local_9d0._0_8_ + 0x1c) == 1) {
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_7c8);
                    bVar5 = (*(int *)(local_7c8._0_8_ + 0x1c) - 2U & 0xfffffffd) == 0;
                    if ((element_type *)local_7c8._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_7c8._8_8_);
                    }
                  }
                  else {
                    bVar5 = false;
                  }
                  if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
                  }
                  if (bVar5) {
                    local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (rOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_7d8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7d8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_7d8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7d8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR0(this,&local_7d8);
                    if (local_7d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_7d8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (lOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_7e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7e8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_7e8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7e8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_dptr_const,&local_7e8,&local_388);
                    if (local_388.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_388.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (local_7e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_7e8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,movx_a_dptr,&local_398,&local_3a8);
                    if (local_3a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_3a8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (local_398.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_398.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,op_atr0,&local_3b8,&local_3c8);
                    _Var4._M_pi = local_3b8.
                                  super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    if (local_3c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_3c8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      _Var4._M_pi = local_3b8.
                                    super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
                    }
                  }
                  else {
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
                    iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
                    if ((iVar1 == 4) || (iVar1 == 2)) {
                      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_160);
                      bVar5 = (*(int *)(local_160._0_8_ + 0x1c) - 2U & 0xfffffffd) == 0;
                    }
                    else {
                      bVar5 = false;
                    }
                    if (((iVar1 == 4) || (iVar1 == 2)) &&
                       ((element_type *)local_160._8_8_ != (element_type *)0x0)) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_160._8_8_);
                    }
                    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
                    }
                    if (!bVar5) {
                      return;
                    }
                    local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (rOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_7f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7f8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_7f8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_7f8.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR0(this,&local_7f8);
                    if (local_7f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_7f8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (lOp->
                             super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr;
                    local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                         _M_refcount._M_pi;
                    if (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_808.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_808.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_808.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_808.
                              super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    generateLoadStackR1(this,&local_808);
                    if (local_808.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_808.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,mov_a_atr1,&local_3d8,&local_3e8);
                    if (local_3e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_3e8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    if (local_3d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_3d8.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_3f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (element_type *)0x0;
                    local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    addCmd(this,op_atr0,&local_3f8,&local_408);
                    _Var4._M_pi = local_3f8.
                                  super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi;
                    if (local_408.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_408.
                                 super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                      _Var4._M_pi = local_3f8.
                                    super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi;
                    }
                  }
                }
                break;
              }
              local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              generateLoadStackR0(this,&local_788);
              if (local_788.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_788.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              uVar3 = local_9d0._20_4_;
              local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
              if (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_dptr_const,&local_798,&local_2e8);
              if (local_2e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2e8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_798.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_798.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,movx_a_dptr,&local_2f8,&local_308);
              if (local_308.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_308.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_2f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_2f8.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_998._0_4_ = B;
              std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                        ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                         (allocator<nigel::IM_SFR> *)local_7c8,(SFR *)local_998);
              uVar2 = local_9d0._8_8_;
              local_80.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_9d0._0_8_;
              local_80.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
              local_9d0._0_8_ = (element_type *)0x0;
              local_9d0._8_8_ = (element_type *)0x0;
              local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_adr_a,&local_80,&local_318);
              if (local_318.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_318.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if ((element_type *)uVar2 != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
              }
              if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
              }
              local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,mov_a_atr0,&local_328,&local_338);
              if (local_338.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_338.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_328.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_328.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              local_998._0_4_ = B;
              std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                        ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                         (allocator<nigel::IM_SFR> *)local_7c8,(SFR *)local_998);
              this_00 = (element_type *)local_9d0._8_8_;
              local_90.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_9d0._0_8_;
              local_90.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
              local_9d0._0_8_ = (element_type *)0x0;
              local_9d0._8_8_ = (element_type *)0x0;
              local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              local_348.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              addCmd(this,uVar3,&local_90,&local_348);
              _Var4._M_pi = local_348.
                            super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
            }
          }
          goto LAB_00159263;
        }
        local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_718);
        if (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_718.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_1d8,&local_1e8);
        if (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if ((element_type *)
            local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_728.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_728.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,local_9d0._20_4_,&local_728,&local_1f8);
        _Var4._M_pi = local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_1f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var4._M_pi = local_728.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
    }
    break;
  case vc:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
    iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
    }
    if (iVar1 == 0) {
      local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_818,&local_418);
      if (local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_418.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_818.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_828.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_828.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_const,&local_828,&local_428);
      _Var4._M_pi = local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_428.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_828.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      if (iVar1 == 1) {
        local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_838,&local_438);
        if (local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_438.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_838.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_448,&local_458);
        if (local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_458.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_448.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if ((element_type *)
            local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_848.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_848.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_const,&local_848,&local_468);
        _Var4._M_pi = local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_468.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var4._M_pi = local_848.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
        iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_858);
        if (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_858.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_478,&local_488);
        if (local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_488.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_478.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if ((element_type *)
            local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&(((element_type *)
                      local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_868.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
            UNLOCK();
          }
          else {
            *(int *)&(((element_type *)
                      local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                     _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr =
                 *(int *)&(((element_type *)
                           local_868.
                           super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                          _M_weak_this.
                          super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                 1;
          }
        }
        local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,op_const,&local_868,&local_498);
        _Var4._M_pi = local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_498.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
          _Var4._M_pi = local_868.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
        }
      }
    }
    break;
  case vt:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
    iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
    }
    uVar3 = local_9d0._20_4_;
    if (iVar1 == 0) {
      local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_adr,&local_878,&local_4a8);
      if (local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_4a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_878.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_9b8._16_4_ = 0xf0;
      std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                 (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
      this_00 = (element_type *)local_9d0._8_8_;
      local_a0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_9d0._0_8_;
      local_a0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
      local_9d0._0_8_ = (element_type *)0x0;
      local_9d0._8_8_ = (element_type *)0x0;
      local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,uVar3,&local_a0,&local_4b8);
      _Var4._M_pi = local_4b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      uVar3 = local_9d0._20_4_;
      if (iVar1 == 1) {
        local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_888,&local_4c8);
        if (local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_888.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_4d8,&local_4e8);
        if (local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        this_00 = (element_type *)local_9d0._8_8_;
        local_b0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_b0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,uVar3,&local_b0,&local_4f8);
        _Var4._M_pi = local_4f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
      else {
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
        iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        if ((iVar1 != 4) && (iVar1 != 2)) {
          return;
        }
        local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        generateLoadStackR0(this,&local_898);
        if (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_898.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_atr0,&local_508,&local_518);
        if (local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_518.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_508.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        this_00 = (element_type *)local_9d0._8_8_;
        local_c0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_c0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,uVar3,&local_c0,&local_528);
        _Var4._M_pi = local_528.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    goto LAB_00159263;
  case cv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
    iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
    }
    if (iVar1 == 0) {
      local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,&local_8a8,&local_538);
      if (local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_538.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_8a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_8b8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_8b8.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,local_9d0._20_4_,&local_8b8,&local_548);
      _Var4._M_pi = local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_548.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_8b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      uVar3 = local_9d0._20_4_;
      if (iVar1 == 1) {
        local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_8c8,&local_558);
        if (local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_558.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_8c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_568,&local_578);
        if (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_578.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_568.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        uVar2 = local_9d0._8_8_;
        local_d0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_d0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_adr_a,&local_d0,&local_588);
        if (local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_588.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_a_const,&local_8d8,&local_598);
        if (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_598.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_8d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        this_00 = (element_type *)local_9d0._8_8_;
        local_e0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_e0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,uVar3,&local_e0,&local_5a8);
        _Var4._M_pi = local_5a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_00159263;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      generateLoadStackR0(this,&local_8e8);
      if (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_8e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,mov_a_const,&local_8f8,&local_5b8);
      if (local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_8f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_atr0,&local_5c8,&local_5d8);
      _Var4._M_pi = local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_5d8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_5c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    break;
  case cc:
    local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (token->super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnTwoConstantsCanBePrevented,&local_908);
    if (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_908.super___shared_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,&local_918,&local_5e8);
    if (local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_5e8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_918.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if ((element_type *)
        local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((element_type *)
                  local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((element_type *)
                  local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                 _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr =
             *(int *)&(((element_type *)
                       local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                      _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1;
      }
    }
    local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_const,&local_928,&local_5f8);
    _Var4._M_pi = local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_5f8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      _Var4._M_pi = local_928.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
    }
    break;
  case ct:
    local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (lOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,mov_a_const,&local_938,&local_608);
    uVar3 = local_9d0._20_4_;
    if (local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_608.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_938.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_9b8._16_4_ = 0xf0;
    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
               (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
    this_00 = (element_type *)local_9d0._8_8_;
    local_f0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_9d0._0_8_;
    local_f0.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
    local_9d0._0_8_ = (element_type *)0x0;
    local_9d0._8_8_ = (element_type *)0x0;
    local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,uVar3,&local_f0,&local_618);
    _Var4._M_pi = local_618.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    goto LAB_00159263;
  case tv:
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
    iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
    if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
    }
    if (iVar1 == 0) {
      local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if ((element_type *)
          local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((element_type *)
                    local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_948.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((element_type *)
                    local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                   _M_weak_this.super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr =
               *(int *)&(((element_type *)
                         local_948.
                         super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->super_enable_shared_from_this<nigel::IM_Operator>).
                        _M_weak_this.
                        super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
        }
      }
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,local_9d0._20_4_,&local_948,&local_628);
      _Var4._M_pi = local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_628.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_948.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    else {
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      if (iVar1 == 1) {
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        uVar2 = local_9d0._8_8_;
        local_100.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_100.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_100,&local_638);
        if (local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_638.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        uVar3 = local_9d0._20_4_;
        local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
        if (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,mov_dptr_const,&local_958,&local_648);
        if (local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_648.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_958.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,movx_a_dptr,&local_658,&local_668);
        if (local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_668.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_658.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        uVar2 = local_9d0._8_8_;
        local_110.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_110.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,xch_a_adr,&local_110,&local_678);
        if (local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_678.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((element_type *)uVar2 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
        }
        if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
        }
        local_9b8._16_4_ = 0xf0;
        std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
                  ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
                   (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
        this_00 = (element_type *)local_9d0._8_8_;
        local_120.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_9d0._0_8_;
        local_120.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
        local_9d0._0_8_ = (element_type *)0x0;
        local_9d0._8_8_ = (element_type *)0x0;
        local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        addCmd(this,uVar3,&local_120,&local_688);
        _Var4._M_pi = local_688.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_00159263;
      }
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_9d0);
      iVar1 = *(int *)(local_9d0._0_8_ + 0x1c);
      if ((element_type *)local_9d0._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_);
      }
      if ((iVar1 != 4) && (iVar1 != 2)) {
        return;
      }
      local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
      if (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      generateLoadStackR0(this,&local_968);
      if (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_968.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      addCmd(this,op_atr0,&local_698,&local_6a8);
      _Var4._M_pi = local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_6a8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var4._M_pi = local_698.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
      }
    }
    break;
  case tc:
    local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (rOp->super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
    ;
    if (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,op_const,&local_978,&local_6b8);
    if (local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_6b8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      return;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_978.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    return;
  case tt:
    local_9b8._16_4_ = 0xf0;
    std::__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<nigel::IM_SFR>,nigel::IM_SFR::SFR&>
              ((__shared_ptr<nigel::IM_SFR,(__gnu_cxx::_Lock_policy)2> *)local_9d0,
               (allocator<nigel::IM_SFR> *)local_9b8,(SFR *)(local_9b8 + 0x10));
    this_00 = (element_type *)local_9d0._8_8_;
    local_140._16_8_ = local_9d0._0_8_;
    local_140._24_8_ = local_9d0._8_8_;
    local_9d0._0_8_ = (element_type *)0x0;
    local_9d0._8_8_ = (element_type *)0x0;
    local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addCmd(this,local_9d0._20_4_,(shared_ptr<nigel::IM_Operator> *)(local_140 + 0x10),&local_6c8);
    _Var4._M_pi = local_6c8.super___shared_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
LAB_00159263:
    if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
    }
    _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
    if (this_00 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
      _Var4._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_9d0._8_8_;
    }
    break;
  default:
    goto switchD_00157036_default;
  }
  if ((element_type *)_Var4._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
  }
switchD_00157036_default:
  return;
}

Assistant:

void IMC_Generator::generateOperation( OperationCombination comb, HexOp op_val, HexOp op_const, HexOp op_atr0, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp, std::shared_ptr<Token> token )
	{
		if( comb == OC::vv )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_atr0 );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				generateLoadStackR1( lOp );
				addCmd( HexOp::mov_a_atr1 );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::vc )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_const, rOp );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_const, rOp );
			}
		}
		else if( comb == OC::vt )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
		}
		else if( comb == OC::cv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_a_const, lOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::cc )
		{
			generateNotification( NT::imp_operationOnTwoConstantsCanBePrevented, token );
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_const, rOp );
		}
		else if( comb == OC::ct )
		{
			addCmd( HexOp::mov_a_const, lOp );
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
		else if( comb == OC::tv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( op_val, rOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::xch_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::xch_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( op_atr0 );
			}
		}
		else if( comb == OC::tc )
		{
			addCmd( op_const, rOp );
		}
		else if( comb == OC::tt )
		{
			addCmd( op_val, IM_SFR::getSFR( IM_SFR::SFR::B ) );
		}
	}